

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O0

void chacha20_key(chacha20 *ctx,uchar *key)

{
  uint32_t uVar1;
  uchar *key_local;
  chacha20 *ctx_local;
  
  uVar1 = GET_32BIT_LSB_FIRST("expand 32-byte k");
  ctx->state[0] = uVar1;
  uVar1 = GET_32BIT_LSB_FIRST("nd 32-byte k");
  ctx->state[1] = uVar1;
  uVar1 = GET_32BIT_LSB_FIRST("2-byte k");
  ctx->state[2] = uVar1;
  uVar1 = GET_32BIT_LSB_FIRST("te k");
  ctx->state[3] = uVar1;
  uVar1 = GET_32BIT_LSB_FIRST(key);
  ctx->state[4] = uVar1;
  uVar1 = GET_32BIT_LSB_FIRST(key + 4);
  ctx->state[5] = uVar1;
  uVar1 = GET_32BIT_LSB_FIRST(key + 8);
  ctx->state[6] = uVar1;
  uVar1 = GET_32BIT_LSB_FIRST(key + 0xc);
  ctx->state[7] = uVar1;
  uVar1 = GET_32BIT_LSB_FIRST(key + 0x10);
  ctx->state[8] = uVar1;
  uVar1 = GET_32BIT_LSB_FIRST(key + 0x14);
  ctx->state[9] = uVar1;
  uVar1 = GET_32BIT_LSB_FIRST(key + 0x18);
  ctx->state[10] = uVar1;
  uVar1 = GET_32BIT_LSB_FIRST(key + 0x1c);
  ctx->state[0xb] = uVar1;
  ctx->currentIndex = 0x40;
  return;
}

Assistant:

static void chacha20_key(struct chacha20 *ctx, const unsigned char *key)
{
    static const char constant[16] = "expand 32-byte k";

    /* Add the fixed string to the start of the state */
    ctx->state[0] = GET_32BIT_LSB_FIRST(constant + 0);
    ctx->state[1] = GET_32BIT_LSB_FIRST(constant + 4);
    ctx->state[2] = GET_32BIT_LSB_FIRST(constant + 8);
    ctx->state[3] = GET_32BIT_LSB_FIRST(constant + 12);

    /* Add the key */
    ctx->state[4]  = GET_32BIT_LSB_FIRST(key + 0);
    ctx->state[5]  = GET_32BIT_LSB_FIRST(key + 4);
    ctx->state[6]  = GET_32BIT_LSB_FIRST(key + 8);
    ctx->state[7]  = GET_32BIT_LSB_FIRST(key + 12);
    ctx->state[8]  = GET_32BIT_LSB_FIRST(key + 16);
    ctx->state[9]  = GET_32BIT_LSB_FIRST(key + 20);
    ctx->state[10] = GET_32BIT_LSB_FIRST(key + 24);
    ctx->state[11] = GET_32BIT_LSB_FIRST(key + 28);

    /* New key, dump context */
    ctx->currentIndex = 64;
}